

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O3

void dynamic_api_suite::api_key_comp(void)

{
  if (boost::detail::test_results()::instance == '\0') {
    api_key_comp();
  }
  if (boost::detail::test_results()::instance == '\0') {
    api_key_comp();
  }
  if (boost::detail::test_results()::instance == '\0') {
    api_key_comp();
  }
  return;
}

Assistant:

void api_key_comp()
{
    pair<int, int> array[4] = {};
    map_view<int, int> span(array);
    BOOST_TEST(!span.key_comp()(11, 10));
    BOOST_TEST(!span.key_comp()(11, 11));
    BOOST_TEST(span.key_comp()(11, 12));
}